

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O2

string * __thiscall
AssemblyCode::MoveRegRegCommand::ToString_abi_cxx11_
          (string *__return_storage_ptr__,MoveRegRegCommand *this)

{
  bool bVar1;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  IRT::CTemp::ToString_abi_cxx11_(&local_d0,&this->target);
  IRT::CTemp::ToString_abi_cxx11_(&local_b0,&this->source);
  bVar1 = std::operator!=(&local_d0,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  if (bVar1) {
    IRT::CTemp::ToString_abi_cxx11_(&local_50,&this->target);
    std::operator+(&local_70,"mov ",&local_50);
    std::operator+(&local_b0,&local_70," ");
    IRT::CTemp::ToString_abi_cxx11_(&local_90,&this->source);
    std::operator+(&local_d0,&local_b0,&local_90);
    std::operator+(__return_storage_ptr__,&local_d0,"\n");
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_d0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AssemblyCode::MoveRegRegCommand::ToString( ) const {
    if (target.ToString() != source.ToString()) {
        return "mov " + target.ToString( ) + " " + source.ToString( ) + "\n";
    } else {
        return "";
    }
}